

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O0

void zip_convert_dos_path(PHYSFS_uint16 entryversion,char *path)

{
  char *pcStack_18;
  PHYSFS_uint8 hosttype;
  char *path_local;
  PHYSFS_uint16 entryversion_local;
  
  pcStack_18 = path;
  if ((char)(entryversion >> 8) == '\0') {
    for (; *pcStack_18 != '\0'; pcStack_18 = pcStack_18 + 1) {
      if (*pcStack_18 == '\\') {
        *pcStack_18 = '/';
      }
    }
  }
  return;
}

Assistant:

static void zip_convert_dos_path(const PHYSFS_uint16 entryversion, char *path)
{
    const PHYSFS_uint8 hosttype = (PHYSFS_uint8) ((entryversion >> 8) & 0xFF);
    if (hosttype == 0)  /* FS_FAT_ */
    {
        while (*path)
        {
            if (*path == '\\')
                *path = '/';
            path++;
        } /* while */
    } /* if */
}